

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams.h
# Opt level: O0

ssize_t __thiscall SpanReader::read(SpanReader *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  Span<const_unsigned_char> *this_00;
  uchar *__src;
  long in_FS_OFFSET;
  Span<const_unsigned_char> SVar5;
  Span<std::byte> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  io_errc in_stack_ffffffffffffff74;
  error_code *in_stack_ffffffffffffff78;
  uchar *local_38;
  size_t local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar2 = Span<std::byte>::size(in_stack_ffffffffffffff68);
  if (sVar2 != 0) {
    sVar2 = Span<std::byte>::size(in_stack_ffffffffffffff68);
    sVar3 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)in_stack_ffffffffffffff68);
    if (sVar3 < sVar2) {
      pcVar4 = (char *)__cxa_allocate_exception(0x20);
      std::error_code::error_code<std::io_errc,void>
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar4,(error_code *)"SpanReader::read(): end of data");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_00741b48;
    }
    this_00 = (Span<const_unsigned_char> *)Span<std::byte>::data(in_stack_ffffffffffffff68);
    __src = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)in_stack_ffffffffffffff68);
    sVar2 = Span<std::byte>::size(in_stack_ffffffffffffff68);
    memcpy(this_00,__src,sVar2);
    Span<std::byte>::size(in_stack_ffffffffffffff68);
    SVar5 = Span<const_unsigned_char>::subspan
                      (this_00,CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    local_38 = SVar5.m_data;
    (this->m_data).m_data = local_38;
    local_30 = SVar5.m_size;
    (this->m_data).m_size = local_30;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
LAB_00741b48:
  __stack_chk_fail();
}

Assistant:

void read(Span<std::byte> dst)
    {
        if (dst.size() == 0) {
            return;
        }

        // Read from the beginning of the buffer
        if (dst.size() > m_data.size()) {
            throw std::ios_base::failure("SpanReader::read(): end of data");
        }
        memcpy(dst.data(), m_data.data(), dst.size());
        m_data = m_data.subspan(dst.size());
    }